

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

PIMFDynamicMetadataDescriptor * __thiscall
ASDCP::MXF::PIMFDynamicMetadataDescriptor::WriteToTLVSet
          (PIMFDynamicMetadataDescriptor *this,TLVWriter *TLVSet)

{
  MDDEntry *value;
  MDDEntry *in_RDX;
  TLVWriter local_80;
  
  if (TLVSet[1].super_MemIOWriter.m_p != (byte_t *)0x0) {
    GenericDataEssenceDescriptor::WriteToTLVSet(&this->super_GenericDataEssenceDescriptor,TLVSet);
    if (-1 < *(int *)&(this->super_GenericDataEssenceDescriptor).super_FileDescriptor.
                      super_GenericDescriptor.super_InterchangeObject.super_KLVPacket.
                      _vptr_KLVPacket) {
      value = Dictionary::Type((Dictionary *)TLVSet[1].super_MemIOWriter.m_p,
                               MDD_PIMFDynamicMetadataDescriptor_GlobalPayloadSID);
      TLVWriter::WriteUi32(&local_80,in_RDX,(ui32_t *)value);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_80);
      Kumu::Result_t::~Result_t((Result_t *)&local_80);
    }
    return this;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x141b,
                "virtual ASDCP::Result_t ASDCP::MXF::PIMFDynamicMetadataDescriptor::WriteToTLVSet(TLVWriter &)"
               );
}

Assistant:

ASDCP::Result_t
PIMFDynamicMetadataDescriptor::WriteToTLVSet(TLVWriter& TLVSet)
{
  assert(m_Dict);
  Result_t result = GenericDataEssenceDescriptor::WriteToTLVSet(TLVSet);
  if ( ASDCP_SUCCESS(result) ) result = TLVSet.WriteUi32(OBJ_WRITE_ARGS(PIMFDynamicMetadataDescriptor, GlobalPayloadSID));
  return result;
}